

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeGetPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,int flags)

{
  MemPage *pMVar1;
  DbPage *local_38;
  DbPage *pDbPage;
  int rc;
  int flags_local;
  MemPage **ppPage_local;
  BtShared *pBStack_18;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  pDbPage._4_4_ = flags;
  _rc = ppPage;
  ppPage_local._4_4_ = pgno;
  pBStack_18 = pBt;
  pDbPage._0_4_ = sqlite3PagerGet(pBt->pPager,pgno,&local_38,flags);
  pBt_local._4_4_ = (int)pDbPage;
  if ((int)pDbPage == 0) {
    pMVar1 = btreePageFromDbPage(local_38,ppPage_local._4_4_,pBStack_18);
    *_rc = pMVar1;
    pBt_local._4_4_ = 0;
  }
  return pBt_local._4_4_;
}

Assistant:

static int btreeGetPage(
  BtShared *pBt,       /* The btree */
  Pgno pgno,           /* Number of the page to fetch */
  MemPage **ppPage,    /* Return the page in this parameter */
  int flags            /* PAGER_GET_NOCONTENT or PAGER_GET_READONLY */
){
  int rc;
  DbPage *pDbPage;

  assert( flags==0 || flags==PAGER_GET_NOCONTENT || flags==PAGER_GET_READONLY );
  assert( sqlite3_mutex_held(pBt->mutex) );
  rc = sqlite3PagerGet(pBt->pPager, pgno, (DbPage**)&pDbPage, flags);
  if( rc ) return rc;
  *ppPage = btreePageFromDbPage(pDbPage, pgno, pBt);
  return SQLITE_OK;
}